

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O0

void __thiscall
TCMallocImplementation::GetStats(TCMallocImplementation *this,char *buffer,int buffer_length)

{
  undefined1 local_30 [8];
  TCMalloc_Printer printer;
  int buffer_length_local;
  char *buffer_local;
  TCMallocImplementation *this_local;
  
  printer._12_4_ = buffer_length;
  TCMalloc_Printer::TCMalloc_Printer((TCMalloc_Printer *)local_30,buffer,buffer_length);
  if ((int)printer._12_4_ < 10000) {
    DumpStats((TCMalloc_Printer *)local_30,1);
  }
  else {
    DumpStats((TCMalloc_Printer *)local_30,2);
  }
  return;
}

Assistant:

virtual void GetStats(char* buffer, int buffer_length) {
    ASSERT(buffer_length > 0);
    TCMalloc_Printer printer(buffer, buffer_length);

    // Print level one stats unless lots of space is available
    if (buffer_length < 10000) {
      DumpStats(&printer, 1);
    } else {
      DumpStats(&printer, 2);
    }
  }